

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void fmt::v11::detail::value<fmt::v11::context>::
     format_custom<fmt::v11::join_view<double_const*,double_const*,char>,fmt::v11::formatter<fmt::v11::join_view<double_const*,double_const*,char>,char,void>>
               (void *arg,parse_context<char> *parse_ctx,context *ctx)

{
  iterator iVar1;
  context *in_RDX;
  parse_context<char> *in_RSI;
  formatter<fmt::v11::join_view<const_double_*,_const_double_*,_char>,_char,_void> *cf;
  formatter<fmt::v11::join_view<const_double_*,_const_double_*,_char>,_char,_void> f;
  formatter<fmt::v11::join_view<const_double_*,_const_double_*,_char>,_char,_void>
  *in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffa8;
  parse_context<char> *in_stack_ffffffffffffffb0;
  undefined1 local_48 [32];
  context *in_stack_ffffffffffffffd8;
  view *in_stack_ffffffffffffffe0;
  
  memset(local_48,0,0x30);
  formatter<fmt::v11::join_view<const_double_*,_const_double_*,_char>,_char,_void>::formatter
            ((formatter<fmt::v11::join_view<const_double_*,_const_double_*,_char>,_char,_void> *)
             0x33c72e);
  formatter<fmt::v11::join_view<const_double_*,_const_double_*,_char>,_char,_void>::parse
            (in_stack_ffffffffffffffa0,in_RSI);
  parse_context<char>::advance_to(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  iVar1 = formatter<fmt::v11::join_view<const_double_*,_const_double_*,_char>,_char,_void>::
          format<fmt::v11::context>
                    ((formatter<fmt::v11::join_view<const_double_*,_const_double_*,_char>,_char,_void>
                      *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  v11::context::advance_to(in_RDX,iVar1);
  return;
}

Assistant:

static void format_custom(void* arg, parse_context<char_type>& parse_ctx,
                            Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_formatter<const T, char_type>(), const T, T>;
    // format must be const for compatibility with std::format and compilation.
    const auto& cf = f;
    ctx.advance_to(cf.format(*static_cast<qualified_type*>(arg), ctx));
  }